

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DynamicTypeHandler::VerifyIsExtensible
          (DynamicTypeHandler *this,ScriptContext *scriptContext,bool alwaysThrow)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = (bool)(this->flags & 1);
  if (((scriptContext != (ScriptContext *)0x0) && (alwaysThrow)) && (bVar2 == false)) {
    bVar1 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar1) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec4a,(PCWSTR)0x0);
    }
  }
  return bVar2;
}

Assistant:

bool DynamicTypeHandler::VerifyIsExtensible(ScriptContext* scriptContext, bool alwaysThrow)
    {
        if (!(this->GetFlags() & IsExtensibleFlag))
        {
            if (alwaysThrow)
            {
                if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NonExtensibleObject);
                }
            }
            return false;
        }

        return true;
    }